

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::GetTranspose(Matrix *__return_storage_ptr__,Matrix *this)

{
  Fraction *pFVar1;
  Fraction *pFVar2;
  int i;
  int j_00;
  int j;
  int i_00;
  
  Matrix(__return_storage_ptr__,this->m_,this->n_,0);
  for (j_00 = 0; j_00 < this->m_; j_00 = j_00 + 1) {
    for (i_00 = 0; i_00 < this->n_; i_00 = i_00 + 1) {
      pFVar1 = At(this,i_00,j_00);
      pFVar2 = At(__return_storage_ptr__,j_00,i_00);
      *pFVar2 = *pFVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::GetTranspose() const {
  Matrix result(m_, n_);
  for (int i = 0; i < m_; ++i) {
    for (int j = 0; j < n_; ++j) {
      result.At(i, j) = At(j, i);
    }
  }

  return result;
}